

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline_tests.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  int iVar3;
  Variable *pVVar4;
  TestEventListener *pTVar5;
  UnitTestSource *pUVar6;
  TestFlag *pTVar7;
  char *pcVar8;
  UnitTest *pUVar9;
  uint uVar10;
  uint uVar11;
  OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option> *in_R9;
  unsigned_long *puVar12;
  RepeatCountSet *pRVar13;
  pointer pcVar14;
  bool bVar15;
  AssertionResult iutest_ar;
  char *targv [2];
  int targc;
  bool file_location_msvc;
  type **in_stack_fffffffffffffd68;
  AssertionResult local_290;
  AssertionHelper local_268;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  char local_1f9;
  undefined1 local_1f8 [128];
  ios_base local_178 [264];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iutest::UnitTest::instance();
  pVVar4 = iutest::TestEnv::get_vars();
  pTVar5 = iutest::TestEventListeners::Release
                     (&pVVar4->m_event_listeners,(pVVar4->m_event_listeners).m_default_xml_generator
                     );
  if (pTVar5 != (TestEventListener *)0x0) {
    (*pTVar5->_vptr_TestEventListener[1])(pTVar5);
  }
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar6);
  iutest::TestEnv::LoadFlagFile();
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_218.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  local_238._0_8_ = *argv;
  local_238._8_8_ = "--help";
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar6);
  iutest::TestEnv::ParseCommandLine<char_const>((int *)&local_218,(char **)local_238);
  iutest::TestEnv::LoadFlagFile();
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
  local_1f8._0_4_ = 1;
  iutest::internal::CmpHelperEQ<int,int>
            (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,(int *)in_R9);
  if (local_290.m_result == false) {
    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1f8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffd6f);
    local_268.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
    ;
    local_268.m_part_result.super_iuCodeMessage.m_line = 0x37;
    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
    std::ios_base::~ios_base(local_178);
  }
  paVar1 = &local_290.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_290.m_message._M_dataplus._M_p,
                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                             local_290.m_message.field_2._M_local_buf[0]) + 1);
  }
  pUVar6 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar6);
  bVar15 = iVar3 != 0;
  uVar11 = (uint)bVar15;
  if (!bVar15) {
    pTVar7 = iutest::TestFlag::GetInstance();
    local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x18 & 1) == 0;
    local_290.m_message._M_string_length = 0;
    local_290.m_message.field_2._M_local_buf[0] = '\0';
    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
    if (!local_290.m_result) {
      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)local_238,(internal *)&local_290,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","true","false",
                 (char *)in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,(char *)local_238._0_8_,(allocator<char> *)&local_218);
      local_268.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
      ;
      local_268.m_part_result.super_iuCodeMessage.m_line = 0x3c;
      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_238._0_8_ != local_228) {
        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
      std::ios_base::~ios_base(local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_290.m_message._M_dataplus._M_p,
                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                               local_290.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_218.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
    local_238._0_8_ = *argv;
    local_238._8_8_ = "--version";
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iutest::UnitTestSource::Initialize(pUVar6);
    iutest::TestEnv::ParseCommandLine<char_const>((int *)&local_218,(char **)local_238);
    iutest::TestEnv::LoadFlagFile();
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
    local_1f8._0_4_ = 1;
    iutest::internal::CmpHelperEQ<int,int>
              (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,(int *)in_R9);
    if (local_290.m_result == false) {
      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffd6f);
      local_268.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
      ;
      local_268.m_part_result.super_iuCodeMessage.m_line = 0x41;
      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
      std::ios_base::~ios_base(local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_290.m_message._M_dataplus._M_p,
                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                               local_290.m_message.field_2._M_local_buf[0]) + 1);
    }
    pcVar8 = iutest::TestEnv::get_color_option();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f8,pcVar8,(allocator<char> *)&local_268);
    iutest::internal::backward::NeHelper<false>::
    Compare<char[3],iutest::TestEnv::OptionString<&iutest::TestEnv::get_color_option,&iutest::TestEnv::set_color_option>>
              (&local_290,(NeHelper<false> *)"\"no\"","::iutest::TestEnv::color()","no",
               (char (*) [3])local_1f8,in_R9);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    if (local_290.m_result == false) {
      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1f8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffd6f);
      local_268.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
      ;
      local_268.m_part_result.super_iuCodeMessage.m_line = 0x42;
      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
      std::ios_base::~ios_base(local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_290.m_message._M_dataplus._M_p,
                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                               local_290.m_message.field_2._M_local_buf[0]) + 1);
    }
    pUVar6 = iutest::UnitTestSource::GetInstance();
    iVar3 = iutest::UnitTestSource::Run(pUVar6);
    if (iVar3 == 0) {
      pTVar7 = iutest::TestFlag::GetInstance();
      local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x19 & 1) == 0;
      local_290.m_message._M_string_length = 0;
      local_290.m_message.field_2._M_local_buf[0] = '\0';
      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
      if (!local_290.m_result) {
        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1f8);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  ((string *)local_238,(internal *)&local_290,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)","true",
                   "false",(char *)in_R9);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,(char *)local_238._0_8_,(allocator<char> *)&local_218);
        local_268.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
        ;
        local_268.m_part_result.super_iuCodeMessage.m_line = 0x46;
        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_
                        ,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                         _0_4_) != &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._4_4_,
                                   local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._0_4_),
                          local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_238._0_8_ != local_228) {
          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
        std::ios_base::~ios_base(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_290.m_message._M_dataplus._M_p,
                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_290.m_message.field_2._M_local_buf[0]) + 1);
      }
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_218.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
      local_238._0_8_ = *argv;
      local_238._8_8_ = "--feature";
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::Initialize(pUVar6);
      iutest::TestEnv::ParseCommandLine<char_const>((int *)&local_218,(char **)local_238);
      iutest::TestEnv::LoadFlagFile();
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
      local_1f8._0_4_ = 1;
      iutest::internal::CmpHelperEQ<int,int>
                (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,(int *)in_R9);
      if (local_290.m_result == false) {
        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1f8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                   (allocator<char> *)&stack0xfffffffffffffd6f);
        local_268.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
        ;
        local_268.m_part_result.super_iuCodeMessage.m_line = 0x4b;
        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_
                        ,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                         _0_4_) != &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._4_4_,
                                   local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._0_4_),
                          local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
        std::ios_base::~ios_base(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290.m_message._M_dataplus._M_p != paVar1) {
        operator_delete(local_290.m_message._M_dataplus._M_p,
                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                 local_290.m_message.field_2._M_local_buf[0]) + 1);
      }
      pUVar6 = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(pUVar6);
      if (iVar3 == 0) {
        pTVar7 = iutest::TestFlag::GetInstance();
        local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x1a & 1) == 0;
        local_290.m_message._M_string_length = 0;
        local_290.m_message.field_2._M_local_buf[0] = '\0';
        local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
        if (!local_290.m_result) {
          memset((iu_global_format_stringstream *)local_1f8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1f8);
          iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                    ((string *)local_238,(internal *)&local_290,
                     (AssertionResult *)
                     "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","true",
                     "false",(char *)in_R9);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,(char *)local_238._0_8_,(allocator<char> *)&local_218);
          local_268.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
          ;
          local_268.m_part_result.super_iuCodeMessage.m_line = 0x4f;
          local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
          iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                          _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._0_4_) !=
              &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._4_4_,
                                     local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._0_4_),
                            local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                            _M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_238._0_8_ != local_228) {
            operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
          std::ios_base::~ios_base(local_178);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_290.m_message._M_dataplus._M_p,
                          CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_290.m_message.field_2._M_local_buf[0]) + 1);
        }
        local_218.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_218.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
        local_238._0_8_ = *argv;
        local_238._8_8_ = "--spec";
        pUVar6 = iutest::UnitTestSource::GetInstance();
        iutest::UnitTestSource::Initialize(pUVar6);
        iutest::TestEnv::ParseCommandLine<char_const>((int *)&local_218,(char **)local_238);
        iutest::TestEnv::LoadFlagFile();
        pUVar6 = iutest::UnitTestSource::GetInstance();
        iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
        local_1f8._0_4_ = 1;
        iutest::internal::CmpHelperEQ<int,int>
                  (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,(int *)in_R9)
        ;
        if (local_290.m_result == false) {
          memset((iu_global_format_stringstream *)local_1f8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1f8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                     (allocator<char> *)&stack0xfffffffffffffd6f);
          local_268.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
          ;
          local_268.m_part_result.super_iuCodeMessage.m_line = 0x54;
          local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
          iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                          _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._0_4_) !=
              &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._4_4_,
                                     local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._0_4_),
                            local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                            _M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
          std::ios_base::~ios_base(local_178);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290.m_message._M_dataplus._M_p != paVar1) {
          operator_delete(local_290.m_message._M_dataplus._M_p,
                          CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                   local_290.m_message.field_2._M_local_buf[0]) + 1);
        }
        pUVar6 = iutest::UnitTestSource::GetInstance();
        iVar3 = iutest::UnitTestSource::Run(pUVar6);
        if (iVar3 == 0) {
          pTVar7 = iutest::TestFlag::GetInstance();
          local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x1b & 1) == 0;
          local_290.m_message._M_string_length = 0;
          local_290.m_message.field_2._M_local_buf[0] = '\0';
          local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
          if (!local_290.m_result) {
            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1f8);
            iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                      ((string *)local_238,(internal *)&local_290,
                       (AssertionResult *)
                       "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)","true",
                       "false",(char *)in_R9);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,(char *)local_238._0_8_,(allocator<char> *)&local_218);
            local_268.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
            ;
            local_268.m_part_result.super_iuCodeMessage.m_line = 0x58;
            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                            _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._4_4_,
                                       local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._0_4_),
                              local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                              _M_allocated_capacity + 1);
            }
            if ((undefined1 *)local_238._0_8_ != local_228) {
              operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_290.m_message._M_dataplus._M_p,
                            CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_290.m_message.field_2._M_local_buf[0]) + 1);
          }
          local_218.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_218.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
          local_238._0_8_ = *argv;
          local_238._8_8_ = "test1";
          local_228._0_8_ = "-v";
          local_228._8_8_ = "test2";
          pUVar6 = iutest::UnitTestSource::GetInstance();
          iutest::UnitTestSource::Initialize(pUVar6);
          iutest::TestEnv::ParseCommandLine<char_const>((int *)&local_218,(char **)local_238);
          iutest::TestEnv::LoadFlagFile();
          pUVar6 = iutest::UnitTestSource::GetInstance();
          iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
          local_1f8._0_4_ = 3;
          iutest::internal::CmpHelperEQ<int,int>
                    (&local_290,(internal *)"3","targc",local_1f8,(int *)&local_218,(int *)in_R9);
          pcVar14 = local_1f8 + 0x10;
          if (local_290.m_result == false) {
            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                       (allocator<char> *)&stack0xfffffffffffffd6f);
            local_268.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
            ;
            local_268.m_part_result.super_iuCodeMessage.m_line = 0x5c;
            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                            _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._4_4_,
                                       local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._0_4_),
                              local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                              _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_290.m_message._M_dataplus._M_p,
                            CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_290.m_message.field_2._M_local_buf[0]) + 1);
          }
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    (&local_290,(internal *)"\"test1\"","targv[1]","test1",(char *)local_238._8_8_,
                     (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
          if (local_290.m_result == false) {
            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                       (allocator<char> *)&stack0xfffffffffffffd6f);
            local_268.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
            ;
            local_268.m_part_result.super_iuCodeMessage.m_line = 0x5d;
            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                            _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._4_4_,
                                       local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._0_4_),
                              local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                              _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_290.m_message._M_dataplus._M_p,
                            CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_290.m_message.field_2._M_local_buf[0]) + 1);
          }
          puVar12 = &iutest_type_traits::enabler_t<void>::value;
          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                    (&local_290,(internal *)"\"test2\"","targv[2]","test2",(char *)local_228._0_8_,
                     (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
          if (local_290.m_result == false) {
            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1f8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                       (allocator<char> *)&stack0xfffffffffffffd6f);
            local_268.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
            ;
            local_268.m_part_result.super_iuCodeMessage.m_line = 0x5e;
            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                            _4_4_,local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._4_4_,
                                       local_268.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p._0_4_),
                              local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                              _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
            std::ios_base::~ios_base(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290.m_message._M_dataplus._M_p != paVar1) {
            operator_delete(local_290.m_message._M_dataplus._M_p,
                            CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                     local_290.m_message.field_2._M_local_buf[0]) + 1);
          }
          pUVar6 = iutest::UnitTestSource::GetInstance();
          iVar3 = iutest::UnitTestSource::Run(pUVar6);
          if (iVar3 == 0) {
            local_238._0_8_ = (long *)0x0;
            local_238._8_8_ = (pointer)0x0;
            local_228._0_8_ = 0;
            local_1f8._0_8_ = pcVar14;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test1","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
            if ((pointer)local_1f8._0_8_ != pcVar14) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            local_1f8._0_8_ = pcVar14;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"-v","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
            if ((pointer)local_1f8._0_8_ != pcVar14) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            local_1f8._0_8_ = pcVar14;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"test2","");
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
            if ((pointer)local_1f8._0_8_ != pcVar14) {
              operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
            }
            pUVar6 = iutest::UnitTestSource::GetInstance();
            iutest::UnitTestSource::Initialize(pUVar6);
            iutest::TestEnv::ParseCommandLine<char>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_238);
            iutest::TestEnv::LoadFlagFile();
            pUVar6 = iutest::UnitTestSource::GetInstance();
            iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar6);
            local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
            local_1f8._0_8_ = (long)(local_238._8_8_ - local_238._0_8_) >> 5;
            iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                      (&local_290,(internal *)"2u","vargv.size()",(char *)&local_268,
                       (uint *)local_1f8,puVar12);
            if (local_290.m_result == false) {
              memset((iu_global_format_stringstream *)local_1f8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1f8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                         (allocator<char> *)&local_218);
              local_268.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
              ;
              local_268.m_part_result.super_iuCodeMessage.m_line = 0x67;
              local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
              iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ._4_4_,local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._0_4_) !=
                  &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._4_4_,
                                         local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._0_4_),
                                local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
              std::ios_base::~ios_base(local_178);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_290.m_message._M_dataplus._M_p,
                              CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_290.m_message.field_2._M_local_buf[0]) + 1);
            }
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_50,*(long *)local_238._0_8_,
                       *(long *)(local_238._0_8_ + 8) + *(long *)local_238._0_8_);
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      (&local_290,(internal *)"\"test1\"","vargv[0]","test1",(char *)local_50,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            if (local_290.m_result == false) {
              memset((iu_global_format_stringstream *)local_1f8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1f8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                         (allocator<char> *)&local_218);
              local_268.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
              ;
              local_268.m_part_result.super_iuCodeMessage.m_line = 0x68;
              local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
              iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ._4_4_,local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._0_4_) !=
                  &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._4_4_,
                                         local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._0_4_),
                                local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
              std::ios_base::~ios_base(local_178);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_290.m_message._M_dataplus._M_p,
                              CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_290.m_message.field_2._M_local_buf[0]) + 1);
            }
            local_70[0] = local_60;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_70,*(long *)(local_238._0_8_ + 0x20),
                       *(long *)(local_238._0_8_ + 0x28) + *(long *)(local_238._0_8_ + 0x20));
            puVar12 = &iutest_type_traits::enabler_t<void>::value;
            iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
                      (&local_290,(internal *)"\"test2\"","vargv[1]","test2",(char *)local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd68);
            if (local_70[0] != local_60) {
              operator_delete(local_70[0],local_60[0] + 1);
            }
            if (local_290.m_result == false) {
              memset((iu_global_format_stringstream *)local_1f8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1f8);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                         (allocator<char> *)&local_218);
              local_268.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
              ;
              local_268.m_part_result.super_iuCodeMessage.m_line = 0x69;
              local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
              iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ._4_4_,local_268.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p._0_4_) !=
                  &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._4_4_,
                                         local_268.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p._0_4_),
                                local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
              std::ios_base::~ios_base(local_178);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290.m_message._M_dataplus._M_p != paVar1) {
              operator_delete(local_290.m_message._M_dataplus._M_p,
                              CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                       local_290.m_message.field_2._M_local_buf[0]) + 1);
            }
            pUVar6 = iutest::UnitTestSource::GetInstance();
            iVar3 = iutest::UnitTestSource::Run(pUVar6);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_238);
            if (iVar3 == 0) {
              pTVar7 = iutest::TestFlag::GetInstance();
              local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x19 & 1) == 0;
              local_290.m_message._M_string_length = 0;
              local_290.m_message.field_2._M_local_buf[0] = '\0';
              local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
              if (!local_290.m_result) {
                memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)local_1f8);
                iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                          ((string *)local_238,(internal *)&local_290,
                           (AssertionResult *)
                           "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)",
                           "true","false",(char *)puVar12);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,(char *)local_238._0_8_,
                           (allocator<char> *)&local_218);
                local_268.m_part_result.super_iuCodeMessage.m_file =
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                ;
                local_268.m_part_result.super_iuCodeMessage.m_line = 0x6e;
                local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._4_4_,
                                local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._0_4_) !=
                    &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                           _M_dataplus._M_p._4_4_,
                                           local_268.m_part_result.super_iuCodeMessage.m_message.
                                           _M_dataplus._M_p._0_4_),
                                  local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                  _M_allocated_capacity + 1);
                }
                if ((undefined1 *)local_238._0_8_ != local_228) {
                  operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                std::ios_base::~ios_base(local_178);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.m_message._M_dataplus._M_p != paVar1) {
                operator_delete(local_290.m_message._M_dataplus._M_p,
                                CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                         local_290.m_message.field_2._M_local_buf[0]) + 1);
              }
              local_218.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_218.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
              local_238._0_8_ = *argv;
              local_238._8_8_ = "-h";
              iutest::InitIrisUnitTest((int *)&local_218,(char **)local_238);
              local_1f8._0_4_ = 1;
              iutest::internal::CmpHelperEQ<int,int>
                        (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,
                         (int *)puVar12);
              if (local_290.m_result == false) {
                memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                iutest::iu_global_format_stringstream::iu_global_format_stringstream
                          ((iu_global_format_stringstream *)local_1f8);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                           (allocator<char> *)&stack0xfffffffffffffd6f);
                local_268.m_part_result.super_iuCodeMessage.m_file =
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                ;
                local_268.m_part_result.super_iuCodeMessage.m_line = 0x73;
                local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._4_4_,
                                local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p._0_4_) !=
                    &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                           _M_dataplus._M_p._4_4_,
                                           local_268.m_part_result.super_iuCodeMessage.m_message.
                                           _M_dataplus._M_p._0_4_),
                                  local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                  _M_allocated_capacity + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                std::ios_base::~ios_base(local_178);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_290.m_message._M_dataplus._M_p != paVar1) {
                operator_delete(local_290.m_message._M_dataplus._M_p,
                                CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                         local_290.m_message.field_2._M_local_buf[0]) + 1);
              }
              pUVar6 = iutest::UnitTestSource::GetInstance();
              iVar3 = iutest::UnitTestSource::Run(pUVar6);
              uVar11 = (uint)bVar15;
              if (iVar3 != 0) {
                uVar11 = 1;
              }
              pcVar8 = local_1f8 + 0x10;
              if (iVar3 == 0) {
                pTVar7 = iutest::TestFlag::GetInstance();
                local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x18 & 1) == 0;
                local_290.m_message._M_string_length = 0;
                local_290.m_message.field_2._M_local_buf[0] = '\0';
                local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                if (!local_290.m_result) {
                  memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)local_1f8);
                  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                            ((string *)local_238,(internal *)&local_290,
                             (AssertionResult *)
                             "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                             "true","false",(char *)puVar12);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_268,(char *)local_238._0_8_,
                             (allocator<char> *)&local_218);
                  local_268.m_part_result.super_iuCodeMessage.m_file =
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                  ;
                  local_268.m_part_result.super_iuCodeMessage.m_line = 0x77;
                  local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                  iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._4_4_,
                                  local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                      &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                             _M_dataplus._M_p._4_4_,
                                             local_268.m_part_result.super_iuCodeMessage.m_message.
                                             _M_dataplus._M_p._0_4_),
                                    local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                    _M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_238._0_8_ != local_228) {
                    operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                  std::ios_base::~ios_base(local_178);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.m_message._M_dataplus._M_p != paVar1) {
                  operator_delete(local_290.m_message._M_dataplus._M_p,
                                  CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                           local_290.m_message.field_2._M_local_buf[0]) + 1);
                }
                local_218.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)CONCAT44(local_218.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
                local_238._0_8_ = *argv;
                local_238._8_8_ = "-?";
                iutest::InitIrisUnitTest((int *)&local_218,(char **)local_238);
                local_1f8._0_4_ = 1;
                iutest::internal::CmpHelperEQ<int,int>
                          (&local_290,(internal *)0x12b008,"targc",local_1f8,(int *)&local_218,
                           (int *)puVar12);
                if (local_290.m_result == false) {
                  memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                  iutest::iu_global_format_stringstream::iu_global_format_stringstream
                            ((iu_global_format_stringstream *)local_1f8);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                             (allocator<char> *)&stack0xfffffffffffffd6f);
                  local_268.m_part_result.super_iuCodeMessage.m_file =
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                  ;
                  local_268.m_part_result.super_iuCodeMessage.m_line = 0x7c;
                  local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                  iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._4_4_,
                                  local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                  _M_p._0_4_) !=
                      &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                             _M_dataplus._M_p._4_4_,
                                             local_268.m_part_result.super_iuCodeMessage.m_message.
                                             _M_dataplus._M_p._0_4_),
                                    local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                    _M_allocated_capacity + 1);
                  }
                  std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                  std::ios_base::~ios_base(local_178);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290.m_message._M_dataplus._M_p != paVar1) {
                  operator_delete(local_290.m_message._M_dataplus._M_p,
                                  CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_,
                                           local_290.m_message.field_2._M_local_buf[0]) + 1);
                }
                pUVar6 = iutest::UnitTestSource::GetInstance();
                iVar3 = iutest::UnitTestSource::Run(pUVar6);
                if (iVar3 == 0) {
                  pTVar7 = iutest::TestFlag::GetInstance();
                  uVar10 = pTVar7->m_test_flags & 0x2000;
                  local_1f9 = (char)(uVar10 >> 0xd);
                  iutest::TestFlag::Fragment<8192>::operator=
                            ((Fragment<8192> *)local_1f8,uVar10 == 0);
                  local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_218.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  local_1f8._0_8_ = pcVar8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1f8,"--iutest_break_on_failure","");
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8);
                  if ((char *)local_1f8._0_8_ != pcVar8) {
                    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                  }
                  local_1f8._0_8_ = pcVar8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1f8,"--iutest_throw_on_failure","");
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8);
                  if ((char *)local_1f8._0_8_ != pcVar8) {
                    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                  }
                  local_1f8._0_8_ = pcVar8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1f8,"--iutest_filter","");
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8);
                  if ((char *)local_1f8._0_8_ != pcVar8) {
                    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                  }
                  local_1f8._0_8_ = pcVar8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1f8,"--iutest_file_location=auto","");
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_218,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8);
                  if ((char *)local_1f8._0_8_ != pcVar8) {
                    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                  }
                  iutest::InitIrisUnitTest<char>(&local_218);
                  local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
                  local_1f8._0_8_ =
                       (long)local_218.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_218.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
                  iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                            (&local_290,(internal *)0x12963e,"vargv.size()",(char *)&local_268,
                             (uint *)local_1f8,puVar12);
                  if (local_290.m_result == false) {
                    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1f8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                               (allocator<char> *)local_238);
                    local_268.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                    ;
                    local_268.m_part_result.super_iuCodeMessage.m_line = 0x8a;
                    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._4_4_,
                                    local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._0_4_) !=
                        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._4_4_,
                                               local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._0_4_),
                                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                    std::ios_base::~ios_base(local_178);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290.m_message._M_dataplus._M_p != paVar1) {
                    operator_delete(local_290.m_message._M_dataplus._M_p,
                                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_
                                             ,local_290.m_message.field_2._M_local_buf[0]) + 1);
                  }
                  pTVar7 = iutest::TestFlag::GetInstance();
                  local_290.m_message._M_string_length = 0;
                  local_290.m_message.field_2._M_local_buf[0] = '\0';
                  local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 4 & 1);
                  local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                  if (local_290.m_result == false) {
                    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1f8);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)local_238,(internal *)&local_290,
                               (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false","true"
                               ,(char *)puVar12);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,(char *)local_238._0_8_,
                               (allocator<char> *)&stack0xfffffffffffffd6f);
                    local_268.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                    ;
                    local_268.m_part_result.super_iuCodeMessage.m_line = 0x8c;
                    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._4_4_,
                                    local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._0_4_) !=
                        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._4_4_,
                                               local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._0_4_),
                                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_238._0_8_ != local_228) {
                      operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                    std::ios_base::~ios_base(local_178);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290.m_message._M_dataplus._M_p != paVar1) {
                    operator_delete(local_290.m_message._M_dataplus._M_p,
                                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_
                                             ,local_290.m_message.field_2._M_local_buf[0]) + 1);
                  }
                  pTVar7 = iutest::TestFlag::GetInstance();
                  local_290.m_message._M_string_length = 0;
                  local_290.m_message.field_2._M_local_buf[0] = '\0';
                  local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 6 & 1);
                  local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                  if (local_290.m_result == false) {
                    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1f8);
                    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                              ((string *)local_238,(internal *)&local_290,
                               (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false","true"
                               ,(char *)puVar12);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,(char *)local_238._0_8_,
                               (allocator<char> *)&stack0xfffffffffffffd6f);
                    local_268.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                    ;
                    local_268.m_part_result.super_iuCodeMessage.m_line = 0x8d;
                    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._4_4_,
                                    local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._0_4_) !=
                        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._4_4_,
                                               local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._0_4_),
                                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    if ((undefined1 *)local_238._0_8_ != local_228) {
                      operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                    std::ios_base::~ios_base(local_178);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290.m_message._M_dataplus._M_p != paVar1) {
                    operator_delete(local_290.m_message._M_dataplus._M_p,
                                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_
                                             ,local_290.m_message.field_2._M_local_buf[0]) + 1);
                  }
                  iutest::TestEnv::
                  OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                  OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                *)local_1f8);
                  pRVar13 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                  iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                            (&local_290,(internal *)"\"*\"","::iutest::TestEnv::filter().c_str()",
                             "*",(char *)local_1f8._0_8_,
                             (char *)&iutest_type_traits::enabler_t<void>::value,
                             in_stack_fffffffffffffd68);
                  if ((char *)local_1f8._0_8_ != pcVar8) {
                    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                  }
                  if (local_290.m_result == false) {
                    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1f8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                               (allocator<char> *)local_238);
                    local_268.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                    ;
                    local_268.m_part_result.super_iuCodeMessage.m_line = 0x8e;
                    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._4_4_,
                                    local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._0_4_) !=
                        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._4_4_,
                                               local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._0_4_),
                                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                    std::ios_base::~ios_base(local_178);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290.m_message._M_dataplus._M_p != paVar1) {
                    operator_delete(local_290.m_message._M_dataplus._M_p,
                                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_
                                             ,local_290.m_message.field_2._M_local_buf[0]) + 1);
                  }
                  iutest::internal::CmpHelperEQ<bool,iutest::TestFlag::Fragment<8192>>
                            (&local_290,(internal *)"file_location_msvc",
                             "::iutest::TestEnv::file_location_style_msvc()",&local_1f9,
                             (bool *)local_1f8,(Fragment<8192> *)pRVar13);
                  if (local_290.m_result == false) {
                    memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                    iutest::iu_global_format_stringstream::iu_global_format_stringstream
                              ((iu_global_format_stringstream *)local_1f8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                               (allocator<char> *)local_238);
                    local_268.m_part_result.super_iuCodeMessage.m_file =
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                    ;
                    local_268.m_part_result.super_iuCodeMessage.m_line = 0x8f;
                    local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                    iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._4_4_,
                                    local_268.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p._0_4_) !=
                        &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._4_4_,
                                               local_268.m_part_result.super_iuCodeMessage.m_message
                                               ._M_dataplus._M_p._0_4_),
                                      local_268.m_part_result.super_iuCodeMessage.m_message.field_2.
                                      _M_allocated_capacity + 1);
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                    std::ios_base::~ios_base(local_178);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_290.m_message._M_dataplus._M_p != paVar1) {
                    operator_delete(local_290.m_message._M_dataplus._M_p,
                                    CONCAT71(local_290.m_message.field_2._M_allocated_capacity._1_7_
                                             ,local_290.m_message.field_2._M_local_buf[0]) + 1);
                  }
                  pUVar9 = iutest::UnitTest::instance();
                  bVar15 = iutest::UnitTest::Failed(pUVar9);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_218);
                  if (!bVar15) {
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x18 & 1) == 0;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!local_290.m_result) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
                                 "true","false",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&local_218);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0x95;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x1a & 1) == 0;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!local_290.m_result) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)"
                                 ,"true","false",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&local_218);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0x96;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_result = ((uint)pTVar7->m_test_flags >> 0x19 & 1) == 0;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!local_290.m_result) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION)"
                                 ,"true","false",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&local_218);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0x97;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    pcVar14 = local_1f8 + 0x10;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_break_on_failure=1","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_throw_on_failure=t","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_also_run_disabled_tests","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_catch_exceptions=yes","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_print_time=n","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_shuffle","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_color=ansi","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_file_location=vs","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_random_seed=200","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_repeat=2","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_filter=Flag*","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_default_package_name=root","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_warning_into_error=t","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_locale_ctype=C","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--iutest_stream_result_to=test","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    local_1f8._0_8_ = pcVar14;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1f8,"--verbose","");
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_218,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
                    if ((pointer)local_1f8._0_8_ != pcVar14) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    iutest::InitIrisUnitTest<char>(&local_218);
                    local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0
                    ;
                    local_1f8._0_8_ =
                         (long)local_218.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_218.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5;
                    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                              (&local_290,(internal *)0x12963e,"vargv.size()",(char *)&local_268,
                               (uint *)local_1f8,(unsigned_long *)pRVar13);
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xae;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 1 & 1);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                 "false","true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb0;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 4 & 1);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                 "true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb1;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 6 & 1);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                 "true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb2;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_result = (pTVar7->m_test_flags & 0x30000U) != 0;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!local_290.m_result) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                 "true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb3;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_result = ((uint)pTVar7->m_test_flags >> 0xc & 1) == 0;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (!local_290.m_result) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                 (char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb4;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = (bool)((byte)pTVar7->m_test_flags & 1);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                 (char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb5;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    uVar10 = (uint)pTVar7->m_test_flags >> 0xd;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = (bool)((byte)uVar10 & 1);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if ((uVar10 & 1) == 0) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                 "false","true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb6;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    bVar2 = (byte)pTVar7->m_test_flags;
                    local_290.m_result = (bool)(bVar2 >> 7);
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (-1 < (char)bVar2) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)"IUTEST_FLAG_GET(warning_into_error)","false",
                                 "true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb7;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    local_1f8._0_4_ = 200;
                    iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
                              (&local_290,(internal *)"200u","::iutest::TestEnv::random_seed()",
                               local_1f8,(uint *)&local_268,(RandomSeedSet *)pRVar13);
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xb9;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    local_1f8._0_4_ = 2;
                    iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
                              (&local_290,(internal *)0x129876,"::iutest::TestEnv::repeat()",
                               local_1f8,(int *)&local_268,pRVar13);
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xba;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                    ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                    *)local_1f8);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&local_290,(internal *)"\"ansi\"",
                               "::iutest::TestEnv::color().c_str()","ansi",(char *)local_1f8._0_8_,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xbc;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>::
                    OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                  *)local_1f8);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&local_290,(internal *)"\"Flag*\"",
                               "::iutest::TestEnv::filter().c_str()","Flag*",(char *)local_1f8._0_8_
                               ,(char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xbd;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                    ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                    *)local_1f8);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&local_290,(internal *)"\"root\"",
                               "::iutest::TestEnv::default_package_name().c_str()","root",
                               (char *)local_1f8._0_8_,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xbe;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                    ::OptionString((OptionString<&iutest::TestEnv::get_locale_ctype,_&iutest::TestEnv::set_locale_ctype>
                                    *)local_1f8);
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&local_290,(internal *)"\"C\"",
                               "::iutest::TestEnv::locale_ctype().c_str()","C",
                               (char *)local_1f8._0_8_,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xbf;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    iutest::TestEnv::
                    OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                    ::OptionString((OptionString<&iutest::TestEnv::get_stream_result_to_c_str,_&iutest::TestEnv::set_stream_result_to>
                                    *)local_1f8);
                    pRVar13 = (RepeatCountSet *)&iutest_type_traits::enabler_t<void>::value;
                    iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                              (&local_290,(internal *)"\"test\"",
                               "::iutest::TestEnv::stream_result_to().c_str()","test",
                               (char *)local_1f8._0_8_,
                               (char *)&iutest_type_traits::enabler_t<void>::value,
                               in_stack_fffffffffffffd68);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    if (local_290.m_result == false) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                 (allocator<char> *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xc1;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pTVar7 = iutest::TestFlag::GetInstance();
                    uVar10 = pTVar7->m_test_flags & 0x4000;
                    local_290.m_message._M_string_length = 0;
                    local_290.m_message.field_2._M_local_buf[0] = '\0';
                    local_290.m_result = SUB41(uVar10 >> 0xe,0);
                    local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                    if (uVar10 == 0) {
                      memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                ((iu_global_format_stringstream *)local_1f8);
                      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                ((string *)local_238,(internal *)&local_290,
                                 (AssertionResult *)
                                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE)",
                                 "false","true",(char *)pRVar13);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_268,(char *)local_238._0_8_,
                                 (allocator<char> *)&stack0xfffffffffffffd6f);
                      local_268.m_part_result.super_iuCodeMessage.m_file =
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                      ;
                      local_268.m_part_result.super_iuCodeMessage.m_line = 0xc3;
                      local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                      iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._4_4_,
                                      local_268.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p._0_4_) !=
                          &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._4_4_,
                                                 local_268.m_part_result.super_iuCodeMessage.
                                                 m_message._M_dataplus._M_p._0_4_),
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_238._0_8_ != local_228) {
                        operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                      std::ios_base::~ios_base(local_178);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_290.m_message._M_dataplus._M_p != paVar1) {
                      operator_delete(local_290.m_message._M_dataplus._M_p,
                                      CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                               _1_7_,local_290.m_message.field_2._M_local_buf[0]) +
                                      1);
                    }
                    pUVar9 = iutest::UnitTest::instance();
                    bVar15 = iutest::UnitTest::Failed(pUVar9);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_218);
                    if (!bVar15) {
                      local_218.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_218.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_218.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_break_on_failure=1","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_throw_on_failure=t","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_also_run_disabled_tests","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_catch_exceptions=yes","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_print_time=n","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_shuffle","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_color=ansi","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_file_location=gcc","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_random_seed=200","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_repeat=2","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--gtest_filter=Flag*","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--iutest_default_package_name=","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_218,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      iutest::InitIrisUnitTest<char>(&local_218);
                      local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
                           0;
                      local_1f8._0_8_ =
                           (long)local_218.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_218.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5;
                      iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                (&local_290,(internal *)0x12963e,"vargv.size()",(char *)&local_268,
                                 (uint *)local_1f8,(unsigned_long *)pRVar13);
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xd7;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 1 & 1);
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(also_run_disabled_tests)",
                                   "false","true",(char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xd9;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 4 & 1);
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(break_on_failure)","false",
                                   "true",(char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xda;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_result = (bool)((byte)pTVar7->m_test_flags >> 6 & 1);
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(throw_on_failure)","false",
                                   "true",(char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xdb;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_result = (pTVar7->m_test_flags & 0x30000U) != 0;
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!local_290.m_result) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(catch_exceptions)","false",
                                   "true",(char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xdc;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_result = ((uint)pTVar7->m_test_flags >> 0xc & 1) == 0;
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!local_290.m_result) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(print_time)","true","false",
                                   (char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xdd;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_result = (bool)((byte)pTVar7->m_test_flags & 1);
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(shuffle)","false","true",
                                   (char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xde;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pTVar7 = iutest::TestFlag::GetInstance();
                      local_290.m_result = ((uint)pTVar7->m_test_flags >> 0xd & 1) == 0;
                      local_290.m_message._M_string_length = 0;
                      local_290.m_message.field_2._M_local_buf[0] = '\0';
                      local_290.m_message._M_dataplus._M_p = (pointer)paVar1;
                      if (!local_290.m_result) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                                  ((string *)local_238,(internal *)&local_290,
                                   (AssertionResult *)"IUTEST_FLAG_GET(file_location_style_msvc)",
                                   "true","false",(char *)pRVar13);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,(char *)local_238._0_8_,
                                   (allocator<char> *)&stack0xfffffffffffffd6f);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xdf;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        if ((undefined1 *)local_238._0_8_ != local_228) {
                          operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      local_1f8._0_4_ = 200;
                      iutest::internal::CmpHelperEQ<unsigned_int,iutest::TestEnv::RandomSeedSet>
                                (&local_290,(internal *)"200u","::iutest::TestEnv::random_seed()",
                                 local_1f8,(uint *)&local_268,(RandomSeedSet *)pRVar13);
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xe1;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      local_1f8._0_4_ = 2;
                      iutest::internal::CmpHelperEQ<int,iutest::TestEnv::RepeatCountSet>
                                (&local_290,(internal *)0x129876,"::iutest::TestEnv::repeat()",
                                 local_1f8,(int *)&local_268,pRVar13);
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xe2;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                      ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                      *)local_1f8);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&local_290,(internal *)"\"ansi\"",
                                 "::iutest::TestEnv::color().c_str()","ansi",(char *)local_1f8._0_8_
                                 ,(char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xe4;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                      ::OptionString((OptionString<&iutest::TestEnv::test_filter,_&iutest::TestEnv::set_test_filter>
                                      *)local_1f8);
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&local_290,(internal *)"\"Flag*\"",
                                 "::iutest::TestEnv::filter().c_str()","Flag*",
                                 (char *)local_1f8._0_8_,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xe5;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                      ::OptionString((OptionString<&iutest::TestEnv::get_default_package_name,_&iutest::TestEnv::set_default_package_name>
                                      *)local_1f8);
                      puVar12 = &iutest_type_traits::enabler_t<void>::value;
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&local_290,(internal *)"\"\"",
                                 "::iutest::TestEnv::default_package_name().c_str()","",
                                 (char *)local_1f8._0_8_,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xe6;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pUVar9 = iutest::UnitTest::instance();
                      bVar15 = iutest::UnitTest::Failed(pUVar9);
                      uVar10 = 1;
                      if (!bVar15) {
                        pVVar4 = iutest::TestEnv::get_vars();
                        pVVar4->m_repeat_count = 1;
                        uVar10 = uVar11;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_218);
                      if (bVar15) {
                        return uVar10;
                      }
                      local_238._0_8_ = (char *)0x0;
                      local_238._8_8_ = (pointer)0x0;
                      local_228._0_8_ = 0;
                      local_1f8._0_8_ = local_1f8 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1f8,"--iutest_color=off","");
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)local_238,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1f8);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      iutest::InitIrisUnitTest<char>
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_238);
                      local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
                           0;
                      local_1f8._0_8_ = (long)(local_238._8_8_ - local_238._0_8_) >> 5;
                      iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                (&local_290,(internal *)0x12963e,"vargv.size()",(char *)&local_268,
                                 (uint *)local_1f8,puVar12);
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)&local_218);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xf1;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      iutest::TestEnv::
                      OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                      ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                      *)local_1f8);
                      puVar12 = &iutest_type_traits::enabler_t<void>::value;
                      iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                (&local_290,(internal *)"\"no\"",
                                 "::iutest::TestEnv::color().c_str()","no",(char *)local_1f8._0_8_,
                                 (char *)&iutest_type_traits::enabler_t<void>::value,
                                 in_stack_fffffffffffffd68);
                      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                      }
                      if (local_290.m_result == false) {
                        memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                  ((iu_global_format_stringstream *)local_1f8);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                   (allocator<char> *)&local_218);
                        local_268.m_part_result.super_iuCodeMessage.m_file =
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                        ;
                        local_268.m_part_result.super_iuCodeMessage.m_line = 0xf2;
                        local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                        iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._4_4_,
                                        local_268.m_part_result.super_iuCodeMessage.m_message.
                                        _M_dataplus._M_p._0_4_) !=
                            &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                          operator_delete((undefined1 *)
                                          CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._4_4_,
                                                   local_268.m_part_result.super_iuCodeMessage.
                                                   m_message._M_dataplus._M_p._0_4_),
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          field_2._M_allocated_capacity + 1);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                        std::ios_base::~ios_base(local_178);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_290.m_message._M_dataplus._M_p != paVar1) {
                        operator_delete(local_290.m_message._M_dataplus._M_p,
                                        CONCAT71(local_290.m_message.field_2._M_allocated_capacity.
                                                 _1_7_,local_290.m_message.field_2._M_local_buf[0])
                                        + 1);
                      }
                      pUVar6 = iutest::UnitTestSource::GetInstance();
                      iVar3 = iutest::UnitTestSource::Run(pUVar6);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_238);
                      if (iVar3 == 0) {
                        local_238._0_8_ = (char *)0x0;
                        local_238._8_8_ = (pointer)0x0;
                        local_228._0_8_ = 0;
                        local_1f8._0_8_ = local_1f8 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1f8,"--iutest_color=1","");
                        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)local_238,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1f8);
                        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                        }
                        iutest::InitIrisUnitTest<char>
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_238);
                        local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_
                             = 0;
                        local_1f8._0_8_ = (long)(local_238._8_8_ - local_238._0_8_) >> 5;
                        iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                  (&local_290,(internal *)0x12963e,"vargv.size()",(char *)&local_268
                                   ,(uint *)local_1f8,puVar12);
                        if (local_290.m_result == false) {
                          memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)local_1f8);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                     (allocator<char> *)&local_218);
                          local_268.m_part_result.super_iuCodeMessage.m_file =
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                          ;
                          local_268.m_part_result.super_iuCodeMessage.m_line = 0xfa;
                          local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                          iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                          _M_dataplus._M_p._4_4_,
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          _M_dataplus._M_p._0_4_) !=
                              &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                            operator_delete((undefined1 *)
                                            CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                     m_message._M_dataplus._M_p._4_4_,
                                                     local_268.m_part_result.super_iuCodeMessage.
                                                     m_message._M_dataplus._M_p._0_4_),
                                            local_268.m_part_result.super_iuCodeMessage.m_message.
                                            field_2._M_allocated_capacity + 1);
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                          std::ios_base::~ios_base(local_178);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_290.m_message._M_dataplus._M_p != paVar1) {
                          operator_delete(local_290.m_message._M_dataplus._M_p,
                                          CONCAT71(local_290.m_message.field_2._M_allocated_capacity
                                                   ._1_7_,local_290.m_message.field_2._M_local_buf
                                                          [0]) + 1);
                        }
                        iutest::TestEnv::
                        OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                        ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                        *)local_1f8);
                        puVar12 = &iutest_type_traits::enabler_t<void>::value;
                        iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                  (&local_290,(internal *)"\"yes\"",
                                   "::iutest::TestEnv::color().c_str()","yes",
                                   (char *)local_1f8._0_8_,
                                   (char *)&iutest_type_traits::enabler_t<void>::value,
                                   in_stack_fffffffffffffd68);
                        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                        }
                        if (local_290.m_result == false) {
                          memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                    ((iu_global_format_stringstream *)local_1f8);
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                     (allocator<char> *)&local_218);
                          local_268.m_part_result.super_iuCodeMessage.m_file =
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                          ;
                          local_268.m_part_result.super_iuCodeMessage.m_line = 0xfb;
                          local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                          iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                          _M_dataplus._M_p._4_4_,
                                          local_268.m_part_result.super_iuCodeMessage.m_message.
                                          _M_dataplus._M_p._0_4_) !=
                              &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                            operator_delete((undefined1 *)
                                            CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                     m_message._M_dataplus._M_p._4_4_,
                                                     local_268.m_part_result.super_iuCodeMessage.
                                                     m_message._M_dataplus._M_p._0_4_),
                                            local_268.m_part_result.super_iuCodeMessage.m_message.
                                            field_2._M_allocated_capacity + 1);
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                          std::ios_base::~ios_base(local_178);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_290.m_message._M_dataplus._M_p != paVar1) {
                          operator_delete(local_290.m_message._M_dataplus._M_p,
                                          CONCAT71(local_290.m_message.field_2._M_allocated_capacity
                                                   ._1_7_,local_290.m_message.field_2._M_local_buf
                                                          [0]) + 1);
                        }
                        pUVar6 = iutest::UnitTestSource::GetInstance();
                        iVar3 = iutest::UnitTestSource::Run(pUVar6);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_238);
                        if (iVar3 == 0) {
                          local_238._0_8_ = (char *)0x0;
                          local_238._8_8_ = (pointer)0x0;
                          local_228._0_8_ = 0;
                          local_1f8._0_8_ = local_1f8 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_1f8,"--iutest_color=auto","");
                          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                          emplace_back<std::__cxx11::string>
                                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                      *)local_238,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_1f8);
                          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                          }
                          iutest::InitIrisUnitTest<char>
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)local_238);
                          local_268.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                          _0_4_ = 0;
                          local_1f8._0_8_ = (long)(local_238._8_8_ - local_238._0_8_) >> 5;
                          iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                                    (&local_290,(internal *)0x12963e,"vargv.size()",
                                     (char *)&local_268,(uint *)local_1f8,puVar12);
                          if (local_290.m_result == false) {
                            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)local_1f8);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                       (allocator<char> *)&local_218);
                            local_268.m_part_result.super_iuCodeMessage.m_file =
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                            ;
                            local_268.m_part_result.super_iuCodeMessage.m_line = 0x103;
                            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                            _M_dataplus._M_p._4_4_,
                                            local_268.m_part_result.super_iuCodeMessage.m_message.
                                            _M_dataplus._M_p._0_4_) !=
                                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                              operator_delete((undefined1 *)
                                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                       m_message._M_dataplus._M_p._4_4_,
                                                       local_268.m_part_result.super_iuCodeMessage.
                                                       m_message._M_dataplus._M_p._0_4_),
                                              local_268.m_part_result.super_iuCodeMessage.m_message.
                                              field_2._M_allocated_capacity + 1);
                            }
                            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                            std::ios_base::~ios_base(local_178);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_290.m_message._M_dataplus._M_p != paVar1) {
                            operator_delete(local_290.m_message._M_dataplus._M_p,
                                            CONCAT71(local_290.m_message.field_2.
                                                     _M_allocated_capacity._1_7_,
                                                     local_290.m_message.field_2._M_local_buf[0]) +
                                            1);
                          }
                          iutest::TestEnv::
                          OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                          ::OptionString((OptionString<&iutest::TestEnv::get_color_option,_&iutest::TestEnv::set_color_option>
                                          *)local_1f8);
                          iutest::internal::CmpHelperSTREQ<char_const*,char_const*>
                                    (&local_290,(internal *)"\"auto\"",
                                     "::iutest::TestEnv::color().c_str()","auto",
                                     (char *)local_1f8._0_8_,
                                     (char *)&iutest_type_traits::enabler_t<void>::value,
                                     in_stack_fffffffffffffd68);
                          if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                            operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                          }
                          if (local_290.m_result == false) {
                            memset((iu_global_format_stringstream *)local_1f8,0,0x188);
                            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                                      ((iu_global_format_stringstream *)local_1f8);
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_268,local_290.m_message._M_dataplus._M_p,
                                       (allocator<char> *)&local_218);
                            local_268.m_part_result.super_iuCodeMessage.m_file =
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/commandline_tests.cpp"
                            ;
                            local_268.m_part_result.super_iuCodeMessage.m_line = 0x104;
                            local_268.m_part_result.super_iuCodeMessage._44_4_ = 1;
                            iutest::AssertionHelper::OnFixed(&local_268,(Fixed *)local_1f8,false);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_268.m_part_result.super_iuCodeMessage.m_message.
                                            _M_dataplus._M_p._4_4_,
                                            local_268.m_part_result.super_iuCodeMessage.m_message.
                                            _M_dataplus._M_p._0_4_) !=
                                &local_268.m_part_result.super_iuCodeMessage.m_message.field_2) {
                              operator_delete((undefined1 *)
                                              CONCAT44(local_268.m_part_result.super_iuCodeMessage.
                                                       m_message._M_dataplus._M_p._4_4_,
                                                       local_268.m_part_result.super_iuCodeMessage.
                                                       m_message._M_dataplus._M_p._0_4_),
                                              local_268.m_part_result.super_iuCodeMessage.m_message.
                                              field_2._M_allocated_capacity + 1);
                            }
                            std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
                            std::ios_base::~ios_base(local_178);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_290.m_message._M_dataplus._M_p != paVar1) {
                            operator_delete(local_290.m_message._M_dataplus._M_p,
                                            CONCAT71(local_290.m_message.field_2.
                                                     _M_allocated_capacity._1_7_,
                                                     local_290.m_message.field_2._M_local_buf[0]) +
                                            1);
                          }
                          pUVar6 = iutest::UnitTestSource::GetInstance();
                          iVar3 = iutest::UnitTestSource::Run(pUVar6);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_238);
                          if (iVar3 == 0) {
                            puts("*** Successful ***");
                            return 0;
                          }
                          return 1;
                        }
                        return 1;
                      }
                      return 1;
                    }
                  }
                }
                uVar11 = 1;
              }
            }
            else {
              uVar11 = 1;
            }
          }
          else {
            uVar11 = 1;
          }
        }
        else {
          uVar11 = 1;
        }
      }
      else {
        uVar11 = 1;
      }
    }
    else {
      uVar11 = 1;
    }
  }
  return uVar11;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_NULLPTR
    {
        int targc = 0;
        IUTEST_INIT(&targc, nullptr);
    }
#endif

    {
        int targc = 2;
        DECAL_ARGV("--help");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("--version");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        IUTEST_EXPECT_NE( "no", IUTEST_FLAG_GET(color) );
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));

        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        int targc = 4;
        const iutest::detail::iu_tchar* targv[] = { argv[0], IU_TSTR("test1"), IU_TSTR("-v"), IU_TSTR("test2") };
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(3, targc);
        IUTEST_EXPECT_STREQ(IU_TSTR("test1"), targv[1]);
        IUTEST_EXPECT_STREQ(IU_TSTR("test2"), targv[2]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("test1");
        vargv.push_back("-v");
        vargv.push_back("test2");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(2u, vargv.size());
        IUTEST_EXPECT_STREQ("test1", vargv[0]);
        IUTEST_EXPECT_STREQ("test2", vargv[1]);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        int targc = 2;
        DECAL_ARGV("-h");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));

        int targc = 2;
        DECAL_ARGV("-?");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(1, targc);
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }

    {
        const bool file_location_msvc = IUTEST_FLAG_GET(file_location_style_msvc);
        IUTEST_FLAG_SET(file_location_style_msvc, !file_location_msvc);

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure");
        vargv.push_back("--iutest_throw_on_failure");
        vargv.push_back("--iutest_filter");
        vargv.push_back("--iutest_file_location=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_STREQ( "*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_EQ   ( file_location_msvc, IUTEST_FLAG_GET(file_location_style_msvc) );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_FALSE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_VERSION));

        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_break_on_failure=1");
        vargv.push_back("--iutest_throw_on_failure=t");
        vargv.push_back("--iutest_also_run_disabled_tests");
        vargv.push_back("--iutest_catch_exceptions=yes");
        vargv.push_back("--iutest_print_time=n");
        vargv.push_back("--iutest_shuffle");
        vargv.push_back("--iutest_color=ansi");
        vargv.push_back("--iutest_file_location=vs");
        vargv.push_back("--iutest_random_seed=200");
        vargv.push_back("--iutest_repeat=2");
        vargv.push_back("--iutest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=root");
        vargv.push_back("--iutest_warning_into_error=t");
        vargv.push_back("--iutest_locale_ctype=C");
#if IUTEST_HAS_STREAM_RESULT
        vargv.push_back("--iutest_stream_result_to=test");
#endif
        vargv.push_back("--verbose");

        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(file_location_style_msvc) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(warning_into_error) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "root", IUTEST_FLAG_GET(default_package_name).c_str() );
        IUTEST_EXPECT_STREQ( "C", IUTEST_FLAG_GET(locale_ctype).c_str() );
#if IUTEST_HAS_STREAM_RESULT
        IUTEST_EXPECT_STREQ( "test", IUTEST_FLAG_GET(stream_result_to).c_str() );
#endif
        IUTEST_EXPECT_TRUE (::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::VERBOSE));

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--gtest_break_on_failure=1");
        vargv.push_back("--gtest_throw_on_failure=t");
        vargv.push_back("--gtest_also_run_disabled_tests");
        vargv.push_back("--gtest_catch_exceptions=yes");
        vargv.push_back("--gtest_print_time=n");
        vargv.push_back("--gtest_shuffle");
        vargv.push_back("--gtest_color=ansi");
        vargv.push_back("--gtest_file_location=gcc");
        vargv.push_back("--gtest_random_seed=200");
        vargv.push_back("--gtest_repeat=2");
        vargv.push_back("--gtest_filter=Flag*");
        vargv.push_back("--iutest_default_package_name=");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());

        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(also_run_disabled_tests) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(break_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(throw_on_failure) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(catch_exceptions) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(print_time) );
        IUTEST_EXPECT_TRUE ( IUTEST_FLAG_GET(shuffle) );
        IUTEST_EXPECT_FALSE( IUTEST_FLAG_GET(file_location_style_msvc) );

        IUTEST_EXPECT_EQ( 200u, IUTEST_FLAG_GET(random_seed) );
        IUTEST_EXPECT_EQ(   2 , IUTEST_FLAG_GET(repeat) );

        IUTEST_EXPECT_STREQ( "ansi", IUTEST_FLAG_GET(color).c_str() );
        IUTEST_EXPECT_STREQ( "Flag*", IUTEST_FLAG_GET(filter).c_str() );
        IUTEST_EXPECT_STREQ( "", IUTEST_FLAG_GET(default_package_name).c_str() );

        if( ::iutest::UnitTest::GetInstance()->Failed() ) return 1;

        IUTEST_FLAG_SET(repeat, 1);
    }

    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=off");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "no", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=1");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "yes", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_color=auto");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(0u, vargv.size());
        IUTEST_EXPECT_STREQ( "auto", IUTEST_FLAG_GET(color).c_str() );

        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}